

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_doing(connectdata *conn,_Bool *dophase_done)

{
  CURLcode CVar1;
  
  if (((conn->handler->flags & 1) == 0) || ((conn->proto).imapc.ssldone == true)) {
    CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,false);
    *dophase_done = (conn->proto).imapc.state == IMAP_STOP;
  }
  else {
    CVar1 = CURLE_NOT_BUILT_IN;
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = pop3_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }

  return result;
}